

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

double __thiscall
baryonyx::itm::default_cost_type<float>::results
          (default_cost_type<float> *this,bit_array *x,double cost_constant)

{
  uint uVar1;
  pointer poVar2;
  index *piVar3;
  ulong uVar4;
  uint uVar5;
  
  poVar2 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->obj->elements).
                super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2;
  if ((int)(uVar4 >> 4) != 0) {
    uVar4 = uVar4 >> 4 & 0xffffffff;
    piVar3 = &poVar2->variable_index;
    do {
      uVar1 = *piVar3;
      uVar5 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar5 = uVar1;
      }
      if (((x->super_bit_array_impl).m_data._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar5 >> 6] >>
           ((ulong)uVar1 & 0x3f) & 1) != 0) {
        cost_constant = cost_constant + ((objective_function_element *)(piVar3 + -2))->factor;
      }
      piVar3 = piVar3 + 4;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return cost_constant;
}

Assistant:

double results(const bit_array& x, double cost_constant) const noexcept
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i)
            if (x[obj.elements[i].variable_index])
                cost_constant += obj.elements[i].factor;

        return cost_constant;
    }